

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  bool bVar1;
  byte *pbVar2;
  char local_42 [8];
  char cs [9];
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  vector<char,_std::allocator<char>_> *__range3;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end3 = std::vector<char,_std::allocator<char>_>::begin(&this->token_string);
  register0x00000000 = std::vector<char,_std::allocator<char>_>::end(&this->token_string);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)(cs + 2)), bVar1) {
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator*(&__end3);
    cs[1] = *pbVar2;
    if ((cs[1] < '\0') || ('\x1f' < cs[1])) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      snprintf(local_42,9,"<U+%.4X>",(ulong)(byte)cs[1]);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_42);
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&__end3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const {
		// escape control characters
		std::string result;
		for (const auto c : token_string) {
			if ('\x00' <= c and c <= '\x1F') {
				// escape control characters
				char cs[9];
				snprintf(cs, 9, "<U+%.4X>", static_cast<unsigned char>(c));
				result += cs;
			} else {
				// add character as is
				result.push_back(c);
			}
		}

		return result;
	}